

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O3

float __thiscall NormalDistribution::getRandomNumber(NormalDistribution *this)

{
  mt19937 *__urng;
  float fVar1;
  double dVar2;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  __urng = &(this->super_Distribution).gen;
  do {
    dVar4 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (__urng);
    dVar6 = (this->super_Distribution).distrib._M_param._M_a;
    dVar7 = (this->super_Distribution).distrib._M_param._M_b;
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (__urng);
    dVar8 = (this->super_Distribution).distrib._M_param._M_a;
    dVar2 = (this->super_Distribution).distrib._M_param._M_b;
    dVar6 = (double)(float)((dVar7 - dVar6) * dVar4 + dVar6);
    dVar7 = log(dVar6);
    dVar7 = exp((-1.0 - dVar7) * (-1.0 - dVar7) * -0.5);
  } while (dVar7 < (double)(float)((dVar2 - dVar8) * dVar5 + dVar8));
  dVar8 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (__urng);
  dVar7 = (this->super_Distribution).distrib._M_param._M_a;
  fVar1 = this->sigma;
  uVar3 = -(uint)((float)(((this->super_Distribution).distrib._M_param._M_b - dVar7) * dVar8 + dVar7
                         ) < 0.5);
  dVar6 = log(dVar6);
  return (float)(dVar6 * (double)(float)(~uVar3 & (uint)-fVar1 | (uint)fVar1 & uVar3) +
                (double)this->mu);
}

Assistant:

float NormalDistribution::getRandomNumber() {
	float u1;
	float u2;
	float u3;
	bool accepted = false;

	while(!accepted){
		u1 = this->distrib(gen);
		u2 = this->distrib(gen);
		if (u2 <= exp(-0.5*pow(-log(u1)-1,2))){
			accepted = true;
		}
	}

	u3 = this->distrib(gen);
	if (u3 < 0.5) return sigma*log(u1)+mu;
	else return -sigma*log(u1)+mu;
}